

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O3

MidiEvent * __thiscall smf::MidiFile::addEvent(MidiFile *this,int aTrack,MidiEvent *mfevent)

{
  MidiEvent *pMVar1;
  ulong uVar2;
  pointer ppMVar3;
  ulong uVar4;
  
  if (this->m_theTrackState == 1) {
    MidiEventList::push_back
              (*(this->m_events).
                super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                _M_impl.super__Vector_impl_data._M_start,mfevent);
    pMVar1 = MidiEventList::back(*(this->m_events).
                                  super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
    pMVar1->track = aTrack;
    ppMVar3 = (this->m_events).
              super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
LAB_0011969c:
    pMVar1 = MidiEventList::back(*ppMVar3);
    return pMVar1;
  }
  uVar4 = (ulong)aTrack;
  ppMVar3 = (this->m_events).
            super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar2 = (long)(this->m_events).
                super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)ppMVar3 >> 3;
  if (uVar4 < uVar2) {
    MidiEventList::push_back(ppMVar3[uVar4],mfevent);
    ppMVar3 = (this->m_events).
              super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar2 = (long)(this->m_events).
                  super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)ppMVar3 >> 3;
    if (uVar4 < uVar2) {
      pMVar1 = MidiEventList::back(ppMVar3[uVar4]);
      pMVar1->track = aTrack;
      ppMVar3 = (this->m_events).
                super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar2 = (long)(this->m_events).
                    super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)ppMVar3 >> 3;
      if (uVar4 < uVar2) {
        ppMVar3 = ppMVar3 + uVar4;
        goto LAB_0011969c;
      }
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4,uVar2
            );
}

Assistant:

MidiEvent* MidiFile::addEvent(int aTrack, MidiEvent& mfevent) {
	if (getTrackState() == TRACK_STATE_JOINED) {
		m_events[0]->push_back(mfevent);
      m_events[0]->back().track = aTrack;
		return &m_events[0]->back();
	} else {
		m_events.at(aTrack)->push_back(mfevent);
		m_events.at(aTrack)->back().track = aTrack;
		return &m_events.at(aTrack)->back();
	}
}